

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

string * __thiscall
cmTarget::ImportedGetFullPath
          (string *__return_storage_ptr__,cmTarget *this,string *config,ArtifactType artifact)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var5;
  cmMakefile *pcVar6;
  bool bVar7;
  PolicyStatus PVar8;
  cmValue cVar9;
  long *plVar10;
  undefined8 *puVar11;
  ulong *puVar12;
  PolicyID id;
  undefined8 uVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string impProp;
  cmValue imp;
  cmValue loc;
  string suffix;
  string desired_config;
  anon_class_24_3_c8775dd5 message;
  string local_128;
  string local_108;
  cmMakefile *local_e8;
  ArtifactType local_dc;
  cmValue local_d8;
  cmValue local_d0;
  string local_c8;
  string local_a8;
  string local_88;
  ArtifactType *local_68;
  string *local_60;
  cmTarget *local_58;
  string local_50;
  
  local_dc = artifact;
  if (((this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget == false) {
    __assert_fail("this->IsImported()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmTarget.cxx"
                  ,0x9fc,
                  "std::string cmTarget::ImportedGetFullPath(const std::string &, cmStateEnums::ArtifactType) const"
                 );
  }
  pcVar4 = (config->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar4,pcVar4 + config->_M_string_length);
  if (config->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_88,0,(char *)local_88._M_string_length,0x7a4a77);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_d0.Value = (string *)0x0;
  local_d8.Value = (string *)0x0;
  paVar3 = &local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_a8._M_dataplus._M_p = (pointer)paVar3;
  if ((((this->impl)._M_t.
        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
        super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 7) &&
     (bVar7 = GetMappedConfig(this,&local_88,&local_d0,&local_d8,&local_a8), bVar7)) {
    if (local_dc == RuntimeBinaryArtifact) {
      if (local_d0.Value == (string *)0x0) {
        local_128._M_dataplus._M_p = &DAT_00000011;
        local_128._M_string_length = 0x7a4a80;
        local_128.field_2._M_allocated_capacity = local_a8._M_string_length;
        local_128.field_2._8_8_ = local_a8._M_dataplus._M_p;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&local_128;
        cmCatViews_abi_cxx11_(&local_108,views_00);
        cVar9 = GetProperty(this,&local_108);
        if (cVar9.Value == (string *)0x0) {
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,"IMPORTED_LOCATION","");
          cVar9 = GetProperty(this,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            local_e8 = (cmMakefile *)cVar9;
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
            cVar9.Value = (string *)local_e8;
          }
          if ((cmMakefile *)cVar9.Value != (cmMakefile *)0x0) {
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
        }
LAB_001e6868:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_001e673d:
        std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      }
    }
    else if (local_dc == ImportLibraryArtifact) {
      if (local_d8.Value != (string *)0x0) goto LAB_001e673d;
      if ((((this->impl)._M_t.
            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
            super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType == 2) ||
         (bVar7 = IsExecutableWithExports(this), bVar7)) {
        local_128._M_dataplus._M_p = (pointer)0xf;
        local_128._M_string_length = 0x7a4a92;
        local_128.field_2._M_allocated_capacity = local_a8._M_string_length;
        local_128.field_2._8_8_ = local_a8._M_dataplus._M_p;
        views._M_len = 2;
        views._M_array = (iterator)&local_128;
        cmCatViews_abi_cxx11_(&local_108,views);
        cVar9 = GetProperty(this,&local_108);
        if (cVar9.Value == (string *)0x0) {
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"IMPORTED_IMPLIB","")
          ;
          cVar9 = GetProperty(this,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            local_e8 = (cmMakefile *)cVar9;
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
            cVar9.Value = (string *)local_e8;
          }
          if ((cmMakefile *)cVar9.Value != (cmMakefile *)0x0) {
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          }
        }
        else {
          std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
        }
        goto LAB_001e6868;
      }
    }
  }
  if (__return_storage_ptr__->_M_string_length != 0) goto LAB_001e6b28;
  _Var5._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var5._M_head_impl)->TargetType != 7) {
    local_68 = &local_dc;
    local_60 = config;
    local_58 = this;
    PVar8 = cmPolicies::PolicyMap::Get(&(_Var5._M_head_impl)->PolicyMap,CMP0111);
    if (PVar8 != OLD) {
      if (PVar8 == WARN) {
        pcVar6 = ((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_50,(cmPolicies *)0x6f,id);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
        paVar2 = &local_108.field_2;
        puVar12 = (ulong *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_108.field_2._M_allocated_capacity = *puVar12;
          local_108.field_2._8_8_ = plVar10[3];
          local_108._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_108.field_2._M_allocated_capacity = *puVar12;
          local_108._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_108._M_string_length = plVar10[1];
        *plVar10 = (long)puVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_e8 = pcVar6;
        ImportedGetFullPath(std::__cxx11::string_const&,cmStateEnums::ArtifactType)::
        operator()[abi_cxx11_(&local_c8,&local_68);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar2) {
          uVar13 = local_108.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_c8._M_string_length + local_108._M_string_length) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            uVar13 = local_c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_c8._M_string_length + local_108._M_string_length)
          goto LAB_001e69e5;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_c8,0,(char *)0x0,(ulong)local_108._M_dataplus._M_p);
        }
        else {
LAB_001e69e5:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_108,(ulong)local_c8._M_dataplus._M_p);
        }
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        psVar1 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_128.field_2._M_allocated_capacity = *psVar1;
          local_128.field_2._8_8_ = puVar11[3];
        }
        else {
          local_128.field_2._M_allocated_capacity = *psVar1;
          local_128._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_128._M_string_length = puVar11[1];
        *puVar11 = psVar1;
        puVar11[1] = 0;
        *(undefined1 *)psVar1 = 0;
        cmMakefile::IssueMessage(local_e8,AUTHOR_WARNING,&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_001e6ac7;
      }
      else {
        pcVar6 = ((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
        ImportedGetFullPath(std::__cxx11::string_const&,cmStateEnums::ArtifactType)::
        operator()[abi_cxx11_(&local_128,&local_68);
        cmMakefile::IssueMessage(pcVar6,FATAL_ERROR,&local_128);
        local_50.field_2._M_allocated_capacity = local_128.field_2._M_allocated_capacity;
        local_50._M_dataplus._M_p = local_128._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p == &local_128.field_2) goto LAB_001e6ac7;
      }
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
LAB_001e6ac7:
  _Var5._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  local_128._M_string_length = *(size_type *)&((_Var5._M_head_impl)->Name)._M_dataplus;
  local_128._M_dataplus._M_p = *(pointer *)((long)&(_Var5._M_head_impl)->Name + 8);
  local_128.field_2._M_allocated_capacity = 9;
  local_128.field_2._8_8_ = (long)"CMAKE_MAKE_PROGRAM-NOTFOUND" + 0x12;
  views_01._M_len = 2;
  views_01._M_array = (iterator)&local_128;
  cmCatViews_abi_cxx11_(&local_108,views_01);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
LAB_001e6b28:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar3) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::ImportedGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  assert(this->IsImported());

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string desired_config = config;
  if (config.empty()) {
    desired_config = "NOCONFIG";
  }

  std::string result;

  cmValue loc = nullptr;
  cmValue imp = nullptr;
  std::string suffix;

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetMappedConfig(desired_config, loc, imp, suffix)) {
    switch (artifact) {
      case cmStateEnums::RuntimeBinaryArtifact:
        if (loc) {
          result = *loc;
        } else {
          std::string impProp = cmStrCat("IMPORTED_LOCATION", suffix);
          if (cmValue config_location = this->GetProperty(impProp)) {
            result = *config_location;
          } else if (cmValue location =
                       this->GetProperty("IMPORTED_LOCATION")) {
            result = *location;
          }
        }
        break;

      case cmStateEnums::ImportLibraryArtifact:
        if (imp) {
          result = *imp;
        } else if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                   this->IsExecutableWithExports()) {
          std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
          if (cmValue config_implib = this->GetProperty(impProp)) {
            result = *config_implib;
          } else if (cmValue implib = this->GetProperty("IMPORTED_IMPLIB")) {
            result = *implib;
          }
        }
        break;
    }
  }

  if (result.empty()) {
    if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      auto message = [&]() -> std::string {
        std::string unset;
        std::string configuration;

        if (artifact == cmStateEnums::RuntimeBinaryArtifact) {
          unset = "IMPORTED_LOCATION";
        } else if (artifact == cmStateEnums::ImportLibraryArtifact) {
          unset = "IMPORTED_IMPLIB";
        }

        if (!config.empty()) {
          configuration = cmStrCat(" configuration \"", config, "\"");
        }

        return cmStrCat(unset, " not set for imported target \"",
                        this->GetName(), "\"", configuration, ".");
      };

      switch (this->GetPolicyStatus(cmPolicies::CMP0111)) {
        case cmPolicies::WARN:
          this->impl->Makefile->IssueMessage(
            MessageType::AUTHOR_WARNING,
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0111) + "\n" +
              message());
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          break;
        default:
          this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                             message());
      }
    }

    result = cmStrCat(this->GetName(), "-NOTFOUND");
  }
  return result;
}